

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_module.cpp
# Opt level: O0

void __thiscall sc_core::sc_module::end_module(sc_module *this)

{
  sc_simcontext *this_00;
  long in_RDI;
  
  if ((*(byte *)(in_RDI + 0xc0) & 1) == 0) {
    sc_get_curr_simcontext((sc_module *)0x2ada06);
    sc_simcontext::hierarchy_pop((sc_simcontext *)0x2ada0e);
    this_00 = sc_get_curr_simcontext((sc_module *)0x2ada18);
    sc_simcontext::reset_curr_proc(this_00);
    sc_sensitive::reset((sc_sensitive *)(in_RDI + 0x78));
    sc_sensitive_pos::reset((sc_sensitive_pos *)(in_RDI + 0x90));
    sc_sensitive_neg::reset((sc_sensitive_neg *)(in_RDI + 0xa8));
    *(undefined1 *)(in_RDI + 0xc0) = 1;
    *(undefined8 *)(in_RDI + 0xe0) = 0;
  }
  return;
}

Assistant:

void
sc_module::end_module()
{
    if( ! m_end_module_called ) {
	/* TBD: Can check here to alert the user that end_module
                was not called for a previous module. */
	(void)sc_get_curr_simcontext()->hierarchy_pop();
	sc_get_curr_simcontext()->reset_curr_proc(); 
	sensitive.reset();
	sensitive_pos.reset();
	sensitive_neg.reset();
	m_end_module_called = true;
	m_module_name_p = 0; // make sure we are not called in ~sc_module().
    }
}